

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

int __thiscall
CVmObject::get_prop(CVmObject *this,vm_prop_id_t prop,vm_val_t *retval,vm_obj_id_t self,
                   vm_obj_id_t *source_obj,uint *argc)

{
  uint uVar1;
  vm_obj_id_t vVar2;
  int iVar3;
  undefined4 in_ECX;
  long *plVar4;
  undefined8 in_RDX;
  undefined2 in_SI;
  CVmMetaclass *in_RDI;
  vm_obj_id_t *in_R8;
  undefined8 in_R9;
  uint func_idx;
  undefined8 in_stack_ffffffffffffffa0;
  code *pcVar5;
  CVmMetaTable *this_00;
  
  this_00 = G_meta_table_X;
  CVmMetaclass::get_reg_idx(metaclass_reg_);
  uVar1 = CVmMetaTable::prop_to_vector_idx
                    (this_00,(uint)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                     (vm_prop_id_t)((ulong)in_stack_ffffffffffffffa0 >> 0x10));
  vVar2 = CVmMetaclass::get_class_obj(in_RDI);
  *in_R8 = vVar2;
  pcVar5 = (code *)func_table_[(ulong)uVar1 * 2];
  plVar4 = (long *)((long)&in_RDI->_vptr_CVmMetaclass + func_table_[(ulong)uVar1 * 2 + 1]);
  if (((ulong)pcVar5 & 1) != 0) {
    pcVar5 = *(code **)(pcVar5 + *plVar4 + -1);
  }
  iVar3 = (*pcVar5)(plVar4,in_ECX,in_RDX,in_R9,in_SI,in_R8);
  return iVar3;
}

Assistant:

int CVmObject::get_prop(VMG_ vm_prop_id_t prop, vm_val_t *retval,
                        vm_obj_id_t self, vm_obj_id_t *source_obj, uint *argc)
{
    uint func_idx;

    /* translate the property index to an index into our function table */
    func_idx = G_meta_table
               ->prop_to_vector_idx(metaclass_reg_->get_reg_idx(), prop);

    /* if we find it, the source object is the 'Object' intrinsic class */
    *source_obj = metaclass_reg_->get_class_obj(vmg0_);

    /* call the appropriate function */
    return (this->*func_table_[func_idx])(vmg_ self, retval, argc,
                                          prop, source_obj);
}